

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

char * ctemplate::ExpandWithCacheIs
                 (TemplateCache *cache,string *filename,Strip strip,TemplateDictionary *dict,
                 PerExpandData *per_expand_data,bool expected)

{
  bool bVar1;
  char *__dest;
  string outstring;
  TemplateString local_50;
  
  outstring._M_dataplus._M_p = (pointer)&outstring.field_2;
  outstring._M_string_length = 0;
  outstring.field_2._M_local_buf[0] = '\0';
  local_50.ptr_ = (filename->_M_dataplus)._M_p;
  local_50.length_ = filename->_M_string_length;
  local_50.is_immutable_ = false;
  local_50.id_ = 0;
  bVar1 = TemplateCache::ExpandWithData
                    (cache,&local_50,strip,(TemplateDictionaryInterface *)dict,per_expand_data,
                     &outstring);
  if (bVar1 == expected) {
    __dest = (char *)operator_new__(outstring._M_string_length + 1);
    strcpy(__dest,outstring._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&outstring);
    return __dest;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xba,
         "expected == cache->ExpandWithData(filename, strip, dict, per_expand_data, &outstring)");
  local_50.ptr_ = (filename->_M_dataplus)._M_p;
  local_50.length_ = filename->_M_string_length;
  local_50.is_immutable_ = false;
  local_50.id_ = 0;
  bVar1 = TemplateCache::ExpandWithData
                    (cache,&local_50,strip,(TemplateDictionaryInterface *)dict,per_expand_data,
                     &outstring);
  if (bVar1 != expected) {
    __assert_fail("expected == cache->ExpandWithData(filename, strip, dict, per_expand_data, &outstring)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                  ,0xba,
                  "const char *ctemplate::ExpandWithCacheIs(TemplateCache *, const string &, Strip, const TemplateDictionary *, PerExpandData *, bool)"
                 );
  }
  exit(1);
}

Assistant:

const char* ExpandWithCacheIs(TemplateCache* cache,
                              const string& filename, Strip strip,
                              const TemplateDictionary *dict,
                              PerExpandData* per_expand_data, bool expected) {
  string outstring;
  ASSERT(expected == cache->ExpandWithData(filename, strip, dict,
                                           per_expand_data, &outstring));


  char* buf = new char[outstring.size()+1];
  strcpy(buf, outstring.c_str());
  return buf;
}